

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

uint __thiscall wabt::interp::Istream::ReadAt<unsigned_int>(Istream *this,Offset *offset)

{
  uint uVar1;
  size_type sVar2;
  uchar *puVar3;
  uint result;
  Offset *offset_local;
  Istream *this_local;
  
  uVar1 = *offset;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if ((ulong)uVar1 + 4 <= sVar2) {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    uVar1 = *(uint *)(puVar3 + *offset);
    *offset = *offset + 4;
    return uVar1;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/istream.cc"
                ,0x6f,"T wabt::interp::Istream::ReadAt(Offset *) const [T = unsigned int]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}